

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileImporter::appendChildToParentNode
          (ObjFileImporter *this,aiNode *pParent,aiNode *pChild)

{
  uint uVar1;
  
  if (pParent == (aiNode *)0x0) {
    __assert_fail("__null != pParent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x301,"void Assimp::ObjFileImporter::appendChildToParentNode(aiNode *, aiNode *)"
                 );
  }
  if (pChild != (aiNode *)0x0) {
    pChild->mParent = pParent;
    uVar1 = pParent->mNumChildren;
    pParent->mNumChildren = uVar1 + 1;
    pParent->mChildren[uVar1] = pChild;
    return;
  }
  __assert_fail("__null != pChild",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                ,0x302,"void Assimp::ObjFileImporter::appendChildToParentNode(aiNode *, aiNode *)");
}

Assistant:

void ObjFileImporter::appendChildToParentNode(aiNode *pParent, aiNode *pChild)
{
    // Checking preconditions
    ai_assert( NULL != pParent );
    ai_assert( NULL != pChild );

    // Assign parent to child
    pChild->mParent = pParent;

    // Copy node instances into parent node
    pParent->mNumChildren++;
    pParent->mChildren[ pParent->mNumChildren-1 ] = pChild;
}